

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O1

void __thiscall cali::Caliper::end_with_value_check(Caliper *this,Attribute *attr,Variant *data)

{
  ThreadData *pTVar1;
  GlobalData *pGVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pCVar4;
  _Bool _Var5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  cali_id_t cVar10;
  ostream *poVar11;
  Node *pNVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  cali_id_t cVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  Channel *channel;
  pointer pCVar16;
  Blackboard *pBVar17;
  mutex *pmVar18;
  undefined1 auVar19 [8];
  cali_id_t key;
  cali_variant_t lhs;
  cali_variant_t rhs;
  string error;
  Entry merged_entry;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c0;
  anon_union_8_7_33918203_for_value local_2b0;
  undefined1 local_2a8 [36];
  uint local_284;
  Attribute local_280;
  string local_278;
  anon_union_8_7_33918203_for_value local_258;
  long local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 local_238 [8];
  anon_union_8_7_33918203_for_value aStack_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [14];
  ios_base local_140 [264];
  int local_38;
  
  if (this->sT->stack_error != false) {
    return;
  }
  uVar6 = Attribute::properties(attr);
  local_284 = uVar6 & 0x3c;
  if (attr->m_node == (Node *)0x0) {
    cVar14 = 0xffffffffffffffff;
  }
  else {
    cVar14 = attr->m_node->m_id;
  }
  key = (ulong)((uVar6 >> 10 & 1) != 0) + 1;
  if ((uVar6 & 1) != 0) {
    key = cVar14;
  }
  pTVar1 = this->sT;
  (pTVar1->lock).m_lock = (pTVar1->lock).m_lock + 1;
  uVar9 = key;
  if (local_284 == 0x14) {
    do {
      uVar8 = (ulong)(uint)(((int)uVar9 + (int)(uVar9 / 0x3fd) * -0x3fd) * 0x20);
      cVar14 = *(cali_id_t *)((long)&(pTVar1->thread_blackboard).hashtable[0].key + uVar8);
      if (cVar14 == key) break;
      uVar9 = uVar9 % 0x3fd + 1;
    } while (cVar14 != 0xffffffffffffffff);
    if (cVar14 == key) {
      local_228[0]._0_8_ =
           *(anon_union_8_7_33918203_for_value *)
            ((long)&(pTVar1->thread_blackboard).hashtable[0].value.m_value.m_v.value + uVar8);
      local_238 = *(undefined1 (*) [8])
                   ((long)&(pTVar1->thread_blackboard).hashtable[0].value.m_node + uVar8);
      aStack_230 = *(anon_union_8_7_33918203_for_value *)
                    ((long)&(pTVar1->thread_blackboard).hashtable[0].value.m_value.m_v.type_and_size
                    + uVar8);
    }
    else {
      local_238 = (undefined1  [8])0x0;
      aStack_230.v_uint = 0;
      local_228[0]._M_allocated_capacity = 0;
    }
    Entry::get((Entry *)local_2a8,(Entry *)local_238,attr);
    cVar10 = 0xffffffffffffffff;
    cVar14 = 0xffffffffffffffff;
    if ((local_238 != (undefined1  [8])0x0) &&
       (cVar14 = *(cali_id_t *)((long)local_238 + 0x30), cVar14 == 8)) {
      cVar14 = *(cali_id_t *)((long)local_238 + 0x10);
    }
    if (attr->m_node != (Node *)0x0) {
      cVar10 = attr->m_node->m_id;
    }
    if (cVar14 == cVar10) {
LAB_001e1936:
      local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238;
      local_2b0.v_uint._1_7_ = local_2a8._17_7_;
      local_2b0.v_bool = (bool)local_2a8[0x10];
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._0_8_;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._8_8_;
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        auVar19 = (undefined1  [8])0x0;
      }
      else {
        auVar19 = local_238;
        if (key == 2) goto LAB_001e1936;
      }
      local_2b0.v_uint = 0;
      anon_unknown.dwarf_40ec13::log_stack_error((Node *)auVar19,attr);
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    }
  }
  else {
    if (local_284 != 0xc) goto LAB_001e1d95;
    pmVar18 = &this->sG->process_blackboard_lock;
    iVar7 = pthread_mutex_lock((pthread_mutex_t *)pmVar18);
    if (iVar7 != 0) {
      std::__throw_system_error(iVar7);
    }
    pGVar2 = this->sG;
    cVar14 = key;
    do {
      uVar9 = (ulong)(uint)(((int)cVar14 + (int)(cVar14 / 0x3fd) * -0x3fd) * 0x20);
      cVar10 = *(cali_id_t *)((long)&(pGVar2->process_blackboard).hashtable[0].key + uVar9);
      if (cVar10 == key) break;
      cVar14 = cVar14 % 0x3fd + 1;
    } while (cVar10 != 0xffffffffffffffff);
    if (cVar10 == key) {
      local_228[0]._0_8_ =
           *(anon_union_8_7_33918203_for_value *)
            ((long)&(pGVar2->process_blackboard).hashtable[0].value.m_value.m_v.value + uVar9);
      local_238 = *(undefined1 (*) [8])
                   ((long)&(pGVar2->process_blackboard).hashtable[0].value.m_node + uVar9);
      aStack_230 = *(anon_union_8_7_33918203_for_value *)
                    ((long)&(pGVar2->process_blackboard).hashtable[0].value.m_value.m_v.
                            type_and_size + uVar9);
    }
    else {
      local_238 = (undefined1  [8])0x0;
      aStack_230.v_uint = 0;
      local_228[0]._M_allocated_capacity = 0;
    }
    Entry::get((Entry *)local_2a8,(Entry *)local_238,attr);
    cVar10 = 0xffffffffffffffff;
    cVar14 = 0xffffffffffffffff;
    if ((local_238 != (undefined1  [8])0x0) &&
       (cVar14 = *(cali_id_t *)((long)local_238 + 0x30), cVar14 == 8)) {
      cVar14 = *(cali_id_t *)((long)local_238 + 0x10);
    }
    if (attr->m_node != (Node *)0x0) {
      cVar10 = attr->m_node->m_id;
    }
    if (cVar14 == cVar10) {
LAB_001e19c9:
      local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238;
      local_2b0.v_uint._1_7_ = local_2a8._17_7_;
      local_2b0.v_bool = (bool)local_2a8[0x10];
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._0_8_;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._8_8_;
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        auVar19 = (undefined1  [8])0x0;
      }
      else {
        auVar19 = local_238;
        if (key == 2) goto LAB_001e19c9;
      }
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      anon_unknown.dwarf_40ec13::log_stack_error((Node *)auVar19,attr);
      local_2b0.v_uint = 0;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)pmVar18);
  }
  if (((paVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) ||
      (paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(data->m_v).type_and_size, paVar3 != paVar13)) ||
     (lhs.value.v_uint = (data->m_v).value.v_uint, lhs.type_and_size = (uint64_t)paVar3,
     rhs.value.v_uint = local_2b0.v_uint, rhs.type_and_size = (uint64_t)paVar13,
     _Var5 = _cali_variant_value_eq(lhs,rhs), !_Var5)) {
    local_280 = (Attribute)attr->m_node;
    pNVar12 = (Node *)(local_2a8 + 0x10);
    local_2a8._8_8_ = 0;
    local_2a8[0x10] = false;
    local_2a8._0_8_ = pNVar12;
    if (paVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::__cxx11::string::_M_replace((ulong)local_2a8,0,(char *)0x0,0x22da46);
    }
    else {
      std::__cxx11::string::_M_replace((ulong)local_2a8,0,(char *)0x0,0x22da55);
      Attribute::name_abi_cxx11_((string *)local_238,&local_280);
      std::__cxx11::string::_M_append(local_2a8,(ulong)local_238);
      if (local_238 != (undefined1  [8])local_228) {
        operator_delete((void *)local_238,local_228[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append(local_2a8);
      local_278._M_string_length = (size_type)local_2b0;
      local_278._M_dataplus._M_p = (pointer)paVar13;
      Variant::to_string_abi_cxx11_((string *)local_238,(Variant *)&local_278);
      std::__cxx11::string::_M_append(local_2a8,(ulong)local_238);
      if (local_238 != (undefined1  [8])local_228) {
        operator_delete((void *)local_238,local_228[0]._M_allocated_capacity + 1);
      }
    }
    poVar11 = (ostream *)local_238;
    std::ofstream::ofstream(poVar11);
    local_38 = 0;
    iVar7 = Log::verbosity();
    if (local_38 <= iVar7) {
      poVar11 = Log::get_stream((Log *)local_238);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"Stack value mismatch: Trying to end ",0x24);
    Attribute::name_abi_cxx11_(&local_278,&local_280);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_278._M_dataplus._M_p,local_278._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"=",1);
    Variant::to_string_abi_cxx11_((string *)&local_258,data);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(char *)local_258.unmanaged_ptr,local_250);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," but ",5);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(char *)local_2a8._0_8_,local_2a8._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    if (local_258 != &local_248) {
      operator_delete(local_258.unmanaged_ptr,local_248._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    local_238 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_238 + _VTT[-1].m_attribute) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)&aStack_230.v_bool);
    std::ios_base::~ios_base(local_140);
    if ((Node *)local_2a8._0_8_ != pNVar12) {
      operator_delete((void *)local_2a8._0_8_,CONCAT71(local_2a8._17_7_,local_2a8[0x10]) + 1);
    }
    this->sT->stack_error = true;
    goto LAB_001e1d95;
  }
  if ((uVar6 & 0x40) == 0) {
    pCVar4 = (this->sG->active_channels).
             super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar16 = (this->sG->active_channels).
                   super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
                   super__Vector_impl_data._M_start; pCVar16 != pCVar4; pCVar16 = pCVar16 + 1) {
      local_278._M_dataplus._M_p =
           (pointer)(pCVar16->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
      aStack_230.v_uint = local_2b0.v_uint;
      local_2a8._0_8_ = this;
      local_238 = (undefined1  [8])paVar13;
      util::
      callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
      ::operator()((callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
                    *)&(((pCVar16->mP).
                         super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       events).pre_end_evt,(Caliper **)local_2a8,(ChannelBody **)&local_278,attr,
                   (Variant *)local_238);
    }
  }
  if (local_284 == 0x14) {
    pBVar17 = &this->sT->thread_blackboard;
    if (((uVar6 & 1) == 0) &&
       (pNVar12 = *(Node **)(local_2c0->_M_allocated_capacity + *(long *)((long)local_2c0 + 8)),
       pNVar12 != (Node *)((long)internal::MetadataTree::mG._M_b._M_p + 0x10))) {
      if (local_2c0 != paVar15) {
        pNVar12 = internal::MetadataTree::remove_first_in_path
                            (&this->sT->tree,(Node *)local_2c0,attr);
      }
      aStack_230 = (anon_union_8_7_33918203_for_value)(pNVar12->m_data).m_v.type_and_size;
      local_228[0]._0_8_ = (pNVar12->m_data).m_v.value;
      local_238 = (undefined1  [8])pNVar12;
      Blackboard::set(pBVar17,key,(Entry *)local_238,-1 < (char)uVar6);
    }
    else {
      Blackboard::del(pBVar17,key);
    }
    goto LAB_001e1d95;
  }
  pmVar18 = &this->sG->process_blackboard_lock;
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)pmVar18);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  pBVar17 = &this->sG->process_blackboard;
  if ((uVar6 & 1) == 0) {
    paVar13 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)(local_2c0->_M_allocated_capacity + *(long *)((long)local_2c0 + 8));
    if (paVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)internal::MetadataTree::mG._M_b._M_p + 0x10)) goto LAB_001e1ede;
    if (local_2c0 != paVar15) {
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)internal::MetadataTree::remove_first_in_path
                             (&this->sT->tree,(Node *)local_2c0,attr);
    }
    aStack_230 = (anon_union_8_7_33918203_for_value)
                 (((Variant *)(paVar13->_M_local_buf + 0x38))->m_v).type_and_size;
    local_228[0]._0_8_ = *(anon_union_8_7_33918203_for_value *)(paVar13->_M_local_buf + 0x40);
    local_238 = (undefined1  [8])paVar13;
    Blackboard::set(pBVar17,key,(Entry *)local_238,-1 < (char)uVar6);
  }
  else {
LAB_001e1ede:
    Blackboard::del(pBVar17,key);
  }
  pthread_mutex_unlock((pthread_mutex_t *)pmVar18);
LAB_001e1d95:
  (pTVar1->lock).m_lock = (pTVar1->lock).m_lock + -1;
  return;
}

Assistant:

void Caliper::end_with_value_check(const Attribute& attr, const Variant& data)
{
    if (sT->stack_error)
        return;

    int prop  = attr.properties();
    int scope = prop & CALI_ATTR_SCOPE_MASK;

    bool run_events = !(prop & CALI_ATTR_SKIP_EVENTS);

    cali_id_t key = get_blackboard_key(attr.id(), prop);
    BlackboardEntry current = { Entry(), Entry( ) };

    std::lock_guard<::siglock> g(sT->lock);

    if (scope == CALI_ATTR_SCOPE_THREAD)
        current = load_current_entry(attr, key, sT->thread_blackboard);
    else if (scope == CALI_ATTR_SCOPE_PROCESS) {
        std::lock_guard<std::mutex> gbb(sG->process_blackboard_lock);
        current = load_current_entry(attr, key, sG->process_blackboard);
    } else
        return;

    if (current.entry.empty() || data != current.entry.value()) {
        log_stack_value_error(current.entry, attr, data);
        sT->stack_error = true;
        return;
    }

    // invoke callbacks
    if (run_events)
        for (auto& channel : sG->active_channels)
            channel.mP->events.pre_end_evt(this, channel.body(), attr, current.entry.value());

    if (scope == CALI_ATTR_SCOPE_THREAD)
        handle_end(attr, prop, current, key, sT->thread_blackboard, sT->tree);
    else {
        std::lock_guard<std::mutex> gbb(sG->process_blackboard_lock);
        handle_end(attr, prop, current, key, sG->process_blackboard, sT->tree);
    }
}